

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O3

cx_string<47UL> * __thiscall
mserialize::cx_strcat<38ul,7ul,1ul,1ul>
          (cx_string<47UL> *__return_storage_ptr__,mserialize *this,cx_string<38UL> *strings,
          cx_string<7UL> *strings_1,cx_string<1UL> *strings_2,cx_string<1UL> *strings_3)

{
  long lVar1;
  ulong uVar2;
  undefined8 *puVar3;
  ulong auStack_98 [6];
  long lStack_68;
  mserialize *local_60;
  cx_string<38UL> *local_58;
  cx_string<7UL> *local_50;
  cx_string<1UL> *local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined7 uStack_20;
  undefined1 uStack_19;
  undefined7 local_18;
  undefined1 uStack_11;
  undefined7 uStack_10;
  
  puVar3 = &local_38;
  local_18 = 0;
  uStack_11 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  uStack_19 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_60 = this;
  local_58 = strings;
  local_50 = strings_1;
  local_48 = strings_2;
  auStack_98[1] = 0x26;
  auStack_98[2] = 7;
  lVar1 = 1;
  auStack_98[3] = 1;
  auStack_98[4] = 1;
  do {
    if (auStack_98[lVar1] != 0) {
      uVar2 = 0;
      do {
        *(undefined1 *)((long)puVar3 + uVar2) = *(undefined1 *)((&lStack_68)[lVar1] + uVar2);
        uVar2 = uVar2 + 1;
      } while (uVar2 < auStack_98[lVar1]);
      puVar3 = (undefined8 *)((long)puVar3 + uVar2);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  __return_storage_ptr__->_data[0x2f] = '\0';
  *(undefined8 *)__return_storage_ptr__->_data = local_38;
  *(undefined8 *)(__return_storage_ptr__->_data + 8) = uStack_30;
  *(undefined8 *)(__return_storage_ptr__->_data + 0x10) = local_28;
  *(ulong *)(__return_storage_ptr__->_data + 0x18) = CONCAT17(uStack_19,uStack_20);
  *(ulong *)(__return_storage_ptr__->_data + 0x1f) = CONCAT71(local_18,uStack_19);
  *(ulong *)(__return_storage_ptr__->_data + 0x27) = CONCAT71(uStack_10,uStack_11);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}